

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

bool __thiscall r_exec::GMonitor::reduce(GMonitor *this,_Fact *input)

{
  MDLController *pMVar1;
  PMDLController *pPVar2;
  PrimaryMDLController *this_00;
  bool bVar3;
  byte bVar4;
  short sVar5;
  uint uVar6;
  int iVar7;
  MatchResult MVar8;
  Fact *pFVar9;
  ulong uVar10;
  Pred *pPVar11;
  _Fact *p_Var12;
  Controller *root;
  Sim *pSVar13;
  undefined4 extraout_var;
  _Fact *this_01;
  Goal *pGVar15;
  HLPBindingMap *pHVar16;
  Fact *pFVar17;
  float fVar18;
  float fVar19;
  Goal *g;
  Goal *affected_goal;
  _Fact *f_success;
  Code *outcome;
  Sim *sim;
  _Fact *_input;
  Pred *prediction;
  _Fact *input_local;
  GMonitor *this_local;
  long *plVar14;
  
  pFVar9 = core::P<r_exec::Fact>::operator->(&(this->super__GMonitor).super_Monitor.target);
  uVar10 = (**(code **)((long)(pFVar9->super__Fact).super_LObject.
                              super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                              super_Code.super__Object._vptr__Object + 0x70))();
  if ((uVar10 & 1) == 0) {
    if ((((this->injected_goal & 1U) == 0) && (this->predicted_evidence != (_Fact *)0x0)) &&
       (uVar6 = (*(this->predicted_evidence->super_LObject).
                  super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                  super__Object._vptr__Object[0xe])(), (uVar6 & 1) != 0)) {
      pPVar2 = (PMDLController *)(this->super__GMonitor).super_Monitor.controller;
      pFVar9 = core::P::operator_cast_to_Fact_((P *)&(this->super__GMonitor).super_Monitor.target);
      pHVar16 = core::P::operator_cast_to_HLPBindingMap_
                          ((P *)&(this->super__GMonitor).super_Monitor.bindings);
      pFVar17 = core::P::operator_cast_to_Fact_((P *)&(this->super__GMonitor).f_imdl);
      PMDLController::register_predicted_goal_outcome
                (pPVar2,pFVar9,pHVar16,pFVar17,false,(bool)(this->injected_goal & 1));
      this->predicted_evidence = (_Fact *)0x0;
      this->injected_goal = true;
      this_local._7_1_ = false;
    }
    else {
      pPVar11 = _Fact::get_pred(input);
      if (pPVar11 == (Pred *)0x0) {
        p_Var12 = &core::P<r_exec::Fact>::operator->(&(this->super__GMonitor).super_Monitor.target)
                   ->super__Fact;
        pGVar15 = _Fact::get_goal(p_Var12);
        bVar3 = Goal::ground_invalidated(pGVar15,input);
        if (bVar3) {
          pFVar9 = core::P<r_exec::Fact>::operator->(&(this->super__GMonitor).super_Monitor.target);
          (**(code **)((long)(pFVar9->super__Fact).super_LObject.
                             super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code
                             .super__Object._vptr__Object + 0x78))();
          this_00 = (PrimaryMDLController *)(this->super__GMonitor).super_Monitor.controller;
          pHVar16 = core::P::operator_cast_to_HLPBindingMap_
                              ((P *)&(this->super__GMonitor).super_Monitor.bindings);
          pSVar13 = core::P<r_exec::Sim>::operator->(&pGVar15->sim);
          pFVar9 = core::P::operator_cast_to_Fact_((P *)&pSVar13->super_goal);
          pSVar13 = core::P<r_exec::Sim>::operator->(&pGVar15->sim);
          bVar3 = pSVar13->opposite;
          fVar18 = _Fact::get_cfd((this->super__GMonitor).goal_target);
          PrimaryMDLController::abduce(this_00,pHVar16,pFVar9,(bool)(bVar3 & 1),(double)fVar18);
          return true;
        }
        MVar8 = _Fact::is_evidence(input,(this->super__GMonitor).goal_target);
        if (MVar8 == MATCH_SUCCESS_POSITIVE) {
          pMVar1 = (this->super__GMonitor).super_Monitor.controller;
          pFVar9 = core::P::operator_cast_to_Fact_
                             ((P *)&(this->super__GMonitor).super_Monitor.target);
          (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[0xf])(pMVar1,pFVar9,1,input);
          return true;
        }
        if (MVar8 == MATCH_SUCCESS_NEGATIVE) {
          pMVar1 = (this->super__GMonitor).super_Monitor.controller;
          pFVar9 = core::P::operator_cast_to_Fact_
                             ((P *)&(this->super__GMonitor).super_Monitor.target);
          (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[0xf])(pMVar1,pFVar9,0,input);
          return true;
        }
        if (MVar8 == MATCH_FAILURE) {
          return false;
        }
      }
      else {
        p_Var12 = Pred::get_target(pPVar11);
        if ((this->super__GMonitor).simulating == 0) {
          MVar8 = _Fact::is_evidence(p_Var12,(this->super__GMonitor).goal_target);
          if (MVar8 == MATCH_SUCCESS_POSITIVE) {
            if ((this->injected_goal & 1U) != 0) {
              pPVar2 = (PMDLController *)(this->super__GMonitor).super_Monitor.controller;
              pFVar9 = core::P::operator_cast_to_Fact_
                                 ((P *)&(this->super__GMonitor).super_Monitor.target);
              pHVar16 = core::P::operator_cast_to_HLPBindingMap_
                                  ((P *)&(this->super__GMonitor).super_Monitor.bindings);
              pFVar17 = core::P::operator_cast_to_Fact_((P *)&(this->super__GMonitor).f_imdl);
              PMDLController::register_predicted_goal_outcome
                        (pPVar2,pFVar9,pHVar16,pFVar17,true,true);
            }
            if (this->predicted_evidence != (_Fact *)0x0) {
              fVar18 = _Fact::get_cfd(p_Var12);
              pPVar11 = _Fact::get_pred(this->predicted_evidence);
              p_Var12 = Pred::get_target(pPVar11);
              fVar19 = _Fact::get_cfd(p_Var12);
              if (fVar19 < fVar18) {
                this->predicted_evidence = input;
              }
            }
            return false;
          }
          if (MVar8 == MATCH_SUCCESS_NEGATIVE) {
            pPVar2 = (PMDLController *)(this->super__GMonitor).super_Monitor.controller;
            pFVar9 = core::P::operator_cast_to_Fact_
                               ((P *)&(this->super__GMonitor).super_Monitor.target);
            pHVar16 = core::P::operator_cast_to_HLPBindingMap_
                                ((P *)&(this->super__GMonitor).super_Monitor.bindings);
            pFVar17 = core::P::operator_cast_to_Fact_((P *)&(this->super__GMonitor).f_imdl);
            PMDLController::register_predicted_goal_outcome
                      (pPVar2,pFVar9,pHVar16,pFVar17,false,(bool)(this->injected_goal & 1));
            this->predicted_evidence = (_Fact *)0x0;
            this->injected_goal = true;
            pFVar9 = core::P<r_exec::Fact>::operator->
                               (&(this->super__GMonitor).super_Monitor.target);
            bVar4 = (**(code **)((long)(pFVar9->super__Fact).super_LObject.
                                       super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                                       super_Code.super__Object._vptr__Object + 0x70))();
            return (bool)(bVar4 & 1);
          }
          if (MVar8 == MATCH_FAILURE) {
            return false;
          }
        }
        else {
          root = core::P::operator_cast_to_Controller_
                           ((P *)&(this->super__GMonitor).super_Monitor.target);
          pSVar13 = Pred::get_simulation(pPVar11,root);
          if (pSVar13 == (Sim *)0x0) {
            return false;
          }
          iVar7 = (*(p_Var12->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                    super_LObject.super_Code.super__Object._vptr__Object[9])(p_Var12,0);
          plVar14 = (long *)CONCAT44(extraout_var,iVar7);
          (**(code **)(*plVar14 + 0x20))(plVar14,0);
          sVar5 = r_code::Atom::asOpcode();
          if (sVar5 == Opcodes::Success) {
            this_01 = (_Fact *)(**(code **)(*plVar14 + 0x48))(plVar14,1);
            pGVar15 = _Fact::get_goal(this_01);
            if (pGVar15 != (Goal *)0x0) {
              bVar3 = _Fact::is_fact(p_Var12);
              _GMonitor::store_simulated_outcome(&this->super__GMonitor,pGVar15,pSVar13,bVar3);
              return false;
            }
          }
          else {
            MVar8 = _Fact::is_evidence(p_Var12,(this->super__GMonitor).goal_target);
            if (MVar8 == MATCH_SUCCESS_POSITIVE) {
              pMVar1 = (this->super__GMonitor).super_Monitor.controller;
              pFVar9 = core::P::operator_cast_to_Fact_
                                 ((P *)&(this->super__GMonitor).super_Monitor.target);
              (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object.
                _vptr__Object[0x10])(pMVar1,pFVar9,1,input);
              return false;
            }
            if (MVar8 == MATCH_SUCCESS_NEGATIVE) {
              pMVar1 = (this->super__GMonitor).super_Monitor.controller;
              pFVar9 = core::P::operator_cast_to_Fact_
                                 ((P *)&(this->super__GMonitor).super_Monitor.target);
              (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object.
                _vptr__Object[0x10])(pMVar1,pFVar9,0,input);
              return false;
            }
            if (MVar8 == MATCH_FAILURE) {
              return false;
            }
          }
        }
      }
      std::operator<<((ostream *)&std::cerr,"reached invalid state!");
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GMonitor::reduce(_Fact *input)   // executed by a reduction core; invalidation check performed in Monitor::is_alive().
{
    if (target->is_invalidated()) {
        return true;
    }

    if (!injected_goal) {
        if (predicted_evidence && predicted_evidence->is_invalidated()) { // the predicted evidence was wrong.
            ((PMDLController *)controller)->register_predicted_goal_outcome(target, bindings, f_imdl, false, injected_goal); // report a predicted failure; this will inject the goal.
            predicted_evidence = nullptr;
            injected_goal = true;
            return false;
        }
    }

    Pred *prediction = input->get_pred();

    if (prediction) { // input is f0->pred->f1->object.
        _Fact *_input = prediction->get_target(); // _input is f1->obj.

        if (simulating) { // injected_goal==true.
            Sim *sim = prediction->get_simulation(target);

            if (sim) {
                Code *outcome = _input->get_reference(0);

                if (outcome->code(0).asOpcode() == Opcodes::Success) { // _input is f1->success or |f1->success.
                    _Fact *f_success = (_Fact *)outcome->get_reference(SUCCESS_OBJ);
                    Goal *affected_goal = f_success->get_goal();

                    if (affected_goal) {
                        store_simulated_outcome(affected_goal, sim, _input->is_fact());
                        return false;
                    }
                } else { // report the simulated outcome: this will inject a simulated prediction of the outcome, to allow any g-monitor deciding on this ground.
                    switch (_input->is_evidence(goal_target)) {
                    case MATCH_SUCCESS_POSITIVE:
                        ((PMDLController *)controller)->register_simulated_goal_outcome(target, true, input); // report a simulated success.
                        return false;

                    case MATCH_SUCCESS_NEGATIVE:
                        ((PMDLController *)controller)->register_simulated_goal_outcome(target, false, input); // report a simulated failure.
                        return false;

                    case MATCH_FAILURE:
                        return false;
                    }
                }
            } else { // during simulation (SIM_ROOT) if the prediction is actual, positive and comes true, we'll eventually catch an actual evidence; otherwise (positive that does not come true or negative), keep simulating: in any case ignore it.
                return false;
            }
        } else {
            switch (_input->is_evidence(goal_target)) {
            case MATCH_SUCCESS_POSITIVE:
                if (injected_goal) {
                    ((PMDLController *)controller)->register_predicted_goal_outcome(target, bindings, f_imdl, true, true);    // report a predicted success.
                }

                if (predicted_evidence && _input->get_cfd() > predicted_evidence->get_pred()->get_target()->get_cfd()) { // bias toward cfd instead of age.
                    predicted_evidence = input;
                }

                return false;

            case MATCH_SUCCESS_NEGATIVE:
                ((PMDLController *)controller)->register_predicted_goal_outcome(target, bindings, f_imdl, false, injected_goal); // report a predicted failure; this may invalidate the target.
                predicted_evidence = nullptr;
                injected_goal = true;
                return target->is_invalidated();

            case MATCH_FAILURE:
                return false;
            }
        }
    } else { // input is an actual fact.
        Goal *g = target->get_goal();

        if (g->ground_invalidated(input)) { // invalidate the goal and abduce from the super-goal.
            target->invalidate();
            ((PrimaryMDLController *)controller)->abduce(bindings, g->sim->super_goal, g->sim->opposite, goal_target->get_cfd());
            return true;
        }

        switch (input->is_evidence(goal_target)) {
        case MATCH_SUCCESS_POSITIVE:
            ((PMDLController *)controller)->register_goal_outcome(target, true, input); // report a success.
            return true;

        case MATCH_SUCCESS_NEGATIVE:
            ((PMDLController *)controller)->register_goal_outcome(target, false, input); // report a failure.
            return true;

        case MATCH_FAILURE:
            return false;
        }
    }

    std::cerr << "reached invalid state!";
    return false;
}